

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  int i_00;
  SparseSet *this_00;
  SparseArray<int> *this_01;
  bool bVar1;
  InstOp IVar2;
  reference pvVar3;
  ostream *poVar4;
  ostream *this_02;
  iterator piVar5;
  int *piVar6;
  reference this_03;
  reference piVar7;
  int local_208;
  int local_204;
  iterator iStack_200;
  int pred;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  iterator piStack_1e0;
  int id_1;
  const_iterator i;
  LogMessage local_1c8;
  Inst *local_48;
  Inst *ip;
  SparseSet *pSStack_38;
  int id;
  SparseSet *reachable_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *predvec_local;
  SparseArray<int> *predmap_local;
  SparseArray<int> *rootmap_local;
  Prog *pPStack_10;
  int root_local;
  Prog *this_local;
  
  pSStack_38 = reachable;
  reachable_local = (SparseSet *)predvec;
  predvec_local =
       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        *)predmap;
  predmap_local = rootmap;
  rootmap_local._4_4_ = root;
  pPStack_10 = this;
  SparseSetT<void>::clear(reachable);
  std::vector<int,_std::allocator<int>_>::clear(stk);
  std::vector<int,_std::allocator<int>_>::push_back
            (stk,(value_type_conflict *)((long)&rootmap_local + 4));
LAB_003726b0:
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(stk);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    for (piStack_1e0 = SparseSetT<void>::begin(pSStack_38);
        piVar5 = SparseSetT<void>::end(pSStack_38), piStack_1e0 != piVar5;
        piStack_1e0 = piStack_1e0 + 1) {
      i_00 = *piStack_1e0;
      bVar1 = SparseArray<int>::has_index((SparseArray<int> *)predvec_local,i_00);
      this_00 = reachable_local;
      if (bVar1) {
        piVar6 = SparseArray<int>::get_existing((SparseArray<int> *)predvec_local,i_00);
        this_03 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)this_00,(long)*piVar6);
        __end3 = std::vector<int,_std::allocator<int>_>::begin(this_03);
        iStack_200 = std::vector<int,_std::allocator<int>_>::end(this_03);
        while (bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                                 (&__end3,&stack0xfffffffffffffe00), ((bVar1 ^ 0xffU) & 1) != 0) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end3);
          local_204 = *piVar7;
          bVar1 = SparseSetT<void>::contains(pSStack_38,local_204);
          if ((!bVar1) &&
             (bVar1 = SparseArray<int>::has_index(predmap_local,i_00), this_01 = predmap_local,
             !bVar1)) {
            local_208 = SparseArray<int>::size(predmap_local);
            SparseArray<int>::set_new(this_01,i_00,&local_208);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3);
        }
      }
    }
    return;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::back(stk);
  ip._4_4_ = *pvVar3;
  std::vector<int,_std::allocator<int>_>::pop_back(stk);
  do {
    bVar1 = SparseSetT<void>::contains(pSStack_38,ip._4_4_);
    if ((bVar1) ||
       ((SparseSetT<void>::insert_new(pSStack_38,ip._4_4_), ip._4_4_ != rootmap_local._4_4_ &&
        (bVar1 = SparseArray<int>::has_index(predmap_local,ip._4_4_), bVar1)))) goto LAB_003726b0;
    local_48 = inst(this,ip._4_4_);
    IVar2 = Inst::opcode(local_48);
    switch(IVar2) {
    case kInstAlt:
    case kInstAltMatch:
      i._0_4_ = Inst::out1(local_48);
      std::vector<int,_std::allocator<int>_>::push_back(stk,(value_type_conflict *)&i);
      ip._4_4_ = Inst::out(local_48);
      break;
    case kInstByteRange:
    case kInstCapture:
    case kInstEmptyWidth:
      goto LAB_003726b0;
    case kInstMatch:
    case kInstFail:
      goto LAB_003726b0;
    case kInstNop:
      ip._4_4_ = Inst::out(local_48);
      break;
    default:
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/prog.cc"
                 ,0x2e5);
      poVar4 = LogMessage::stream(&local_1c8);
      this_02 = std::operator<<((ostream *)poVar4,"unhandled opcode: ");
      IVar2 = Inst::opcode(local_48);
      std::ostream::operator<<(this_02,IVar2);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
    }
  } while( true );
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}